

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::InstrumentedProxy::runOnFunction
          (InstrumentedProxy *this,Module *module,Function *func)

{
  bool bVar1;
  Pass *this_00;
  
  bVar1 = ModuleAnalyzer::needsInstrumentation(this->analyzer,func);
  if (bVar1) {
    this_00 = (this->pass)._M_t.super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
              super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
    if (this_00->runner == (PassRunner *)0x0) {
      Pass::setPassRunner(this_00,(this->super_Pass).runner);
      this_00 = (this->pass)._M_t.
                super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
    }
    (*this_00->_vptr_Pass[3])(this_00,module,func);
    return;
  }
  return;
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    if (!analyzer->needsInstrumentation(func)) {
      return;
    }
    if (pass->getPassRunner() == nullptr) {
      pass->setPassRunner(getPassRunner());
    }
    pass->runOnFunction(module, func);
  }